

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall
btSoftBody::appendAnchor
          (btSoftBody *this,int node,btRigidBody *body,bool disableCollisionBetweenLinkedBodies,
          btScalar influence)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Node *pNVar4;
  btVector3 local;
  btVector3 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_58;
  float local_54;
  float local_50;
  float local_48;
  float local_44;
  float local_40;
  undefined8 local_38;
  float local_30;
  
  btTransform::inverse(&(body->super_btCollisionObject).m_worldTransform);
  pNVar4 = (this->m_nodes).m_data;
  fVar1 = pNVar4[node].m_x.m_floats[0];
  fVar2 = pNVar4[node].m_x.m_floats[1];
  fVar3 = pNVar4[node].m_x.m_floats[2];
  local_78.m_floats[1] =
       (float)((ulong)local_38 >> 0x20) + local_50 * fVar3 + local_58 * fVar1 + local_54 * fVar2;
  local_78.m_floats[0] = (float)local_38 + fStack_60 * fVar3 + local_68 * fVar1 + fStack_64 * fVar2;
  local_78.m_floats[2] = local_40 * fVar3 + local_48 * fVar1 + local_44 * fVar2 + local_30;
  local_78.m_floats[3] = 0.0;
  appendAnchor(this,node,body,&local_78,disableCollisionBetweenLinkedBodies,influence);
  return;
}

Assistant:

void			btSoftBody::appendAnchor(int node,btRigidBody* body, bool disableCollisionBetweenLinkedBodies,btScalar influence)
{
	btVector3 local = body->getWorldTransform().inverse()*m_nodes[node].m_x;
	appendAnchor(node,body,local,disableCollisionBetweenLinkedBodies,influence);
}